

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVRAII.cxx
# Opt level: O2

int testUVRAII(int param_1,char **param_2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  uv_async_s *puVar6;
  uv_pipe_s *puVar7;
  uv_stream_s *puVar8;
  char *pcVar9;
  uv_handle_ptr_base_<uv_handle_s> local_478;
  uv_async_ptr signal;
  uv_async_ptr signalTmp;
  uv_loop_t Loop;
  
  iVar4 = uv_loop_init(&Loop);
  if (iVar4 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Could not init loop");
    std::endl<char,std::char_traits<char>>(poVar5);
    return -1;
  }
  signal.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
  super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  signal.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
  super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cm::uv_async_ptr::init(&signal,(EVP_PKEY_CTX *)&Loop);
  local_478.handle.super___shared_ptr<uv_handle_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  signalTmp.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
  super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0x10);
  (signalTmp.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
   super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->data = &PTR___State_00553330;
  (signalTmp.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
   super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->loop = (uv_loop_t *)&signal;
  std::thread::_M_start_thread(&local_478,&signalTmp,0);
  if (signalTmp.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
      super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    (**(code **)((long)(signalTmp.super_uv_handle_ptr_<uv_async_s>.
                        super_uv_handle_ptr_base_<uv_async_s>.handle.
                        super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->data + 8
                ))();
  }
  std::thread::detach();
  std::thread::~thread((thread *)&local_478);
  iVar4 = uv_run(&Loop,UV_RUN_DEFAULT);
  if (iVar4 != 0) {
    pcVar9 = "Unclean exit state in testAsyncDtor";
LAB_001473f6:
    poVar5 = std::operator<<((ostream *)&std::cerr,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar5);
    cm::uv_handle_ptr_base_<uv_async_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_async_s> *)&signal);
    return -1;
  }
  puVar6 = cm::uv_handle_ptr_base_<uv_async_s>::get((uv_handle_ptr_base_<uv_async_s> *)&signal);
  if (puVar6 != (uv_async_s *)0x0) {
    pcVar9 = "Loop exited with signal not being cleaned up";
    goto LAB_001473f6;
  }
  cm::uv_handle_ptr_base_<uv_async_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_async_s> *)&signal);
  uv_loop_close(&Loop);
  iVar4 = uv_loop_init(&Loop);
  if (iVar4 == 0) {
    signal.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
    super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    signal.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
    super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cm::uv_async_ptr::init(&signal,(EVP_PKEY_CTX *)&Loop);
    cm::uv_handle_ptr_base_<uv_async_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_async_s> *)&signal);
    iVar4 = uv_run(&Loop,UV_RUN_DEFAULT);
    if (iVar4 != 0) {
      pcVar9 = "Unclean exit state in testAsyncDtor";
      goto LAB_001474ab;
    }
    uv_loop_close(&Loop);
    bVar3 = 0;
  }
  else {
    pcVar9 = "Could not init loop";
LAB_001474ab:
    poVar5 = std::operator<<((ostream *)&std::cerr,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar5);
    bVar3 = 1;
  }
  iVar4 = uv_loop_init(&Loop);
  if (iVar4 == 0) {
    signal.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
    super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    signal.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
    super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    signalTmp.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
    super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    signalTmp.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
    super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cm::uv_async_ptr::init(&signalTmp,(EVP_PKEY_CTX *)&Loop);
    std::__shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2> *)&signal,
               (__shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2> *)&signalTmp);
    cm::uv_handle_ptr_base_<uv_async_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_async_s> *)&signalTmp);
    cm::uv_handle_ptr_base_<uv_async_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_async_s> *)&signal);
    iVar4 = uv_run(&Loop,UV_RUN_DEFAULT);
    if (iVar4 != 0) {
      pcVar9 = "Unclean exit state in testAsyncDtor";
      goto LAB_00147552;
    }
    uv_loop_close(&Loop);
    bVar2 = 0;
  }
  else {
    pcVar9 = "Could not init loop";
LAB_00147552:
    poVar5 = std::operator<<((ostream *)&std::cerr,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar5);
    bVar2 = 1;
  }
  iVar4 = uv_loop_init(&Loop);
  if (iVar4 == 0) {
    signal.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
    super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    signal.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
    super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cm::uv_pipe_ptr::init((uv_pipe_ptr *)&signal,(EVP_PKEY_CTX *)&Loop);
    cm::uv_handle_ptr_base_<uv_stream_s>::uv_handle_ptr_base_<cm::uv_pipe_ptr,void>
              ((uv_handle_ptr_base_<uv_stream_s> *)&signalTmp,(uv_pipe_ptr *)&signal);
    puVar7 = cm::uv_handle_ptr_base_<uv_pipe_s>::get((uv_handle_ptr_base_<uv_pipe_s> *)&signal);
    if (puVar7 == (uv_pipe_s *)0x0) {
      cm::uv_handle_ptr_base_<uv_handle_s>::
      uv_handle_ptr_base_<cm::uv_handle_ptr_<uv_stream_s>,void>
                (&local_478,(uv_handle_ptr_<uv_stream_s> *)&signalTmp);
      puVar8 = cm::uv_handle_ptr_base_<uv_stream_s>::get
                         ((uv_handle_ptr_base_<uv_stream_s> *)&signalTmp);
      if (puVar8 == (uv_stream_s *)0x0) {
        cm::uv_handle_ptr_base_<uv_handle_s>::~uv_handle_ptr_base_(&local_478);
        cm::uv_handle_ptr_base_<uv_stream_s>::~uv_handle_ptr_base_
                  ((uv_handle_ptr_base_<uv_stream_s> *)&signalTmp);
        cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
                  ((uv_handle_ptr_base_<uv_pipe_s> *)&signal);
        iVar4 = uv_run(&Loop,UV_RUN_DEFAULT);
        if (iVar4 == 0) {
          uv_loop_close(&Loop);
          bVar1 = 0;
          goto LAB_00147676;
        }
        pcVar9 = "Unclean exit state in testCrossAssignment";
        goto LAB_00147580;
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "Move should be sure to invalidate the previous ptr");
      std::endl<char,std::char_traits<char>>(poVar5);
      cm::uv_handle_ptr_base_<uv_handle_s>::~uv_handle_ptr_base_(&local_478);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "Move should be sure to invalidate the previous ptr");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    cm::uv_handle_ptr_base_<uv_stream_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_stream_s> *)&signalTmp);
    cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_pipe_s> *)&signal);
  }
  else {
    pcVar9 = "Could not init loop";
LAB_00147580:
    poVar5 = std::operator<<((ostream *)&std::cerr,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  bVar1 = 1;
LAB_00147676:
  Loop.data = (void *)0x0;
  Loop.active_handles = 0;
  Loop._12_4_ = 0;
  signalTmp.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
  super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  signalTmp.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
  super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  signal.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
  super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  signal.super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle.
  super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Loop.handle_queue[0] = (void *)0x0;
  Loop.handle_queue[1] = (void *)0x0;
  Loop.active_reqs.unused[0] = (void *)0x0;
  Loop.active_reqs.unused[1] = (void *)0x0;
  Loop.stop_flag = 0;
  Loop._52_4_ = 0;
  Loop.flags = 0;
  Loop.backend_fd = 0;
  Loop._68_4_ = 0;
  Loop.pending_queue[0] = (void *)0x0;
  Loop.pending_queue[1] = (void *)0x0;
  Loop.watcher_queue[0] = (void *)0x0;
  Loop.watcher_queue[1] = (void *)0x0;
  Loop.watchers = (uv__io_t **)0x0;
  Loop.nwatchers = 0;
  Loop.nfds = 0;
  Loop.wq[0] = (void *)0x0;
  anon_func::allTypes::~allTypes((allTypes *)&signalTmp);
  anon_func::allTypes::~allTypes((allTypes *)&signal);
  anon_func::allTypes::~allTypes((allTypes *)&Loop);
  if ((bool)(bVar3 | bVar2 | bVar1)) {
    return -1;
  }
  return 0;
}

Assistant:

int testUVRAII(int, char** const)
{
  if ((testAsyncShutdown() &&
       testAsyncDtor() & testAsyncMove() & testCrossAssignment() &
         testAllMoves()) == 0) {
    return -1;
  }
  return 0;
}